

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_opengl.h
# Opt level: O3

djg_mesh * djgm_load_cap(float angle,int slices,int stacks)

{
  djgm_vertex *pdVar1;
  float __x;
  uint uVar2;
  djg_mesh *pdVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  
  pdVar3 = djgm_load_plane(slices,stacks);
  if (-2 < slices) {
    uVar2 = stacks + 2;
    uVar5 = 1;
    if (1 < (int)uVar2) {
      uVar5 = (ulong)uVar2;
    }
    lVar4 = 0x38;
    uVar7 = 0;
    do {
      if (-2 < stacks) {
        pdVar1 = pdVar3->vertexv;
        lVar6 = 0;
        do {
          fVar8 = *(float *)((long)pdVar1 + lVar6 + lVar4 + -0x28);
          fVar9 = *(float *)((long)pdVar1 + lVar6 + lVar4 + -0x24);
          __x = (fVar9 + fVar9) * 3.1415927;
          *(float *)((long)pdVar1 + lVar6 + lVar4 + -0x28) = fVar9;
          *(float *)((long)pdVar1 + lVar6 + lVar4 + -0x24) = fVar8;
          fVar8 = fVar8 * angle;
          *(undefined8 *)((long)pdVar1 + lVar6 + lVar4 + -0x20) = 0;
          fVar9 = sinf(fVar8);
          fVar10 = cosf(__x);
          *(float *)((long)pdVar1 + lVar6 + lVar4 + -0x38) = fVar10 * fVar9;
          fVar9 = sinf(fVar8);
          fVar10 = sinf(__x);
          *(float *)((long)pdVar1 + lVar6 + lVar4 + -0x34) = fVar10 * fVar9;
          fVar9 = cosf(fVar8);
          *(float *)((long)pdVar1 + lVar6 + lVar4 + -0x30) = fVar9;
          fVar9 = cosf(fVar8);
          fVar10 = cosf(__x);
          *(float *)((long)pdVar1 + lVar6 + lVar4 + -0x18) = fVar10 * fVar9;
          fVar9 = cosf(fVar8);
          fVar10 = sinf(__x);
          *(float *)((long)pdVar1 + lVar6 + lVar4 + -0x14) = fVar10 * fVar9;
          fVar8 = sinf(fVar8);
          *(float *)((long)pdVar1 + lVar6 + lVar4 + -0x10) = -fVar8;
          fVar8 = sinf(__x);
          *(float *)((long)pdVar1 + lVar6 + lVar4 + -8) = -fVar8;
          fVar8 = cosf(__x);
          *(float *)((long)pdVar1 + lVar6 + lVar4 + -4) = fVar8;
          *(undefined4 *)((long)&(pdVar1->p).x + lVar6 + lVar4) = 0;
          lVar6 = lVar6 + 0x40;
        } while (uVar5 * 0x40 != lVar6);
      }
      uVar7 = uVar7 + 1;
      lVar4 = lVar4 + (long)(int)uVar2 * 0x40;
    } while (uVar7 != slices + 2);
  }
  return pdVar3;
}

Assistant:

DJGDEF djg_mesh *djgm_load_cap(float angle, int slices, int stacks)
{
    djg_mesh *mesh = djgm_load_plane(slices, stacks);
    int i, j;

    slices+= 2;
    stacks+= 2;

    for (i = 0; i < slices; ++i)
    for (j = 0; j < stacks; ++j) {
        djgm_vertex *v = &mesh->vertexv[i * stacks + j];
        float theta = v->st.s * angle;
        float phi = v->st.t * 2.f * M_PI;
        float tmp = v->st.s;

        v->st.s = v->st.t;
        v->st.t = tmp;
        v->st.p = 0;
        v->st.q = 0;

        v->p.x = sin(theta) * cos(phi);
        v->p.y = sin(theta) * sin(phi);
        v->p.z = cos(theta);

        v->dpds.x = cos(theta) * cos(phi);
        v->dpds.y = cos(theta) * sin(phi);
        v->dpds.z = -sin(theta);

        v->dpdt.x = -sin(phi);
        v->dpdt.y = cos(phi);
        v->dpdt.z = 0.f;
    }

    return mesh;
}